

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Validator::get_description_abi_cxx11_(string *__return_storage_ptr__,Validator *this)

{
  Validator *this_local;
  
  if ((this->active_ & 1U) == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(__return_storage_ptr__,&this->desc_function_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_description() const {
        if(active_) {
            return desc_function_();
        }
        return std::string{};
    }